

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O2

int polymul::polynomial<double,_2,_10>::term_index(int *exponents)

{
  int iVar1;
  int iVar2;
  int ndeg;
  int nvar;
  
  iVar2 = 0;
  nvar = 2;
  for (ndeg = exponents[1] + *exponents + -1; -1 < ndeg; ndeg = ndeg - iVar1) {
    iVar1 = polylen(nvar,ndeg);
    iVar2 = iVar2 + iVar1;
    iVar1 = *exponents;
    nvar = nvar + -1;
    exponents = exponents + 1;
  }
  return iVar2;
}

Assistant:

static int term_index(const int exponents[Nvar]) {
    int N = 0;
    for (int i = 0; i < Nvar; i++)
      N += exponents[i];
    int i = 0, idx = 0;
    N--;
    while (N >= 0) {
      idx += polylen(Nvar - i, N);
      N -= exponents[i];
      i++;
    }
    return idx;
  }